

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_term_compute.cpp
# Opt level: O3

void __thiscall SourceTermCompute::upward_pass(SourceTermCompute *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  Molecule *pMVar8;
  InterpolationPoints *pIVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  long lVar13;
  int k2;
  pointer pdVar14;
  ulong uVar15;
  size_type __n;
  ulong uVar16;
  size_type sVar17;
  ulong uVar18;
  size_t node_idx;
  Tree *this_00;
  int k3;
  int iVar19;
  ulong uVar20;
  pointer pdVar21;
  size_type sVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  array<unsigned_long,_2UL> aVar34;
  vector<int,_std::allocator<int>_> exact_idx_x;
  vector<int,_std::allocator<int>_> exact_idx_z;
  vector<int,_std::allocator<int>_> exact_idx_y;
  vector<double,_std::allocator<double>_> weights;
  vector<double,_std::allocator<double>_> denominator;
  allocator_type local_181;
  unsigned_long local_180;
  ulong local_178;
  unsigned_long local_170;
  int local_164;
  pointer local_160;
  pointer local_158;
  pointer local_150;
  SourceTermCompute *local_148;
  pointer local_140;
  size_type local_138;
  size_t local_130;
  pointer local_128;
  pointer local_120;
  pointer local_118;
  pointer local_110;
  pointer local_108;
  pointer local_100;
  vector<int,_std::allocator<int>_> local_f8;
  pointer local_e0;
  pointer local_d8;
  long local_d0;
  long local_c8;
  pointer local_c0;
  pointer local_b8;
  pointer local_b0;
  pointer local_a8;
  pointer local_a0;
  pointer local_98;
  void *local_90 [2];
  long local_80;
  void *local_78 [2];
  long local_68;
  vector<double,_std::allocator<double>_> local_60;
  void *local_48 [2];
  long local_38;
  
  uVar7 = this->num_mol_interp_pts_per_node_;
  sVar22 = (size_type)(int)uVar7;
  local_d0 = (long)this->num_mol_interp_charges_per_node_;
  pMVar8 = this->molecule_;
  pIVar9 = this->mol_interp_pts_;
  local_120 = (pMVar8->super_Particles).x_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  pdVar21 = (pMVar8->super_Particles).y_.super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start;
  local_128 = (pMVar8->super_Particles).z_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_d8 = (pMVar8->charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_150 = (pIVar9->interp_x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_158 = (pIVar9->interp_y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_160 = (pIVar9->interp_z_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_e0 = (this->mol_interp_charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_148 = this;
  std::vector<double,_std::allocator<double>_>::vector(&local_60,sVar22,(allocator_type *)&local_f8)
  ;
  auVar11 = _DAT_0011a8d0;
  auVar10 = _DAT_0011a8c0;
  auVar28 = _DAT_0011a8b0;
  auVar29 = _DAT_0011a2a0;
  uVar12 = (uint)((ulong)((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_finish -
                         (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar12) {
    lVar13 = (ulong)(uVar12 & 0x7fffffff) - 1;
    auVar24._8_4_ = (int)lVar13;
    auVar24._0_8_ = lVar13;
    auVar24._12_4_ = (int)((ulong)lVar13 >> 0x20);
    uVar16 = 0;
    auVar24 = auVar24 ^ _DAT_0011a2a0;
    auVar26 = _DAT_0011a290;
    do {
      auVar30 = auVar26 ^ auVar29;
      auVar31._4_4_ = auVar26._0_4_;
      auVar31._0_4_ = auVar26._4_4_;
      auVar31._8_4_ = auVar26._12_4_;
      auVar31._12_4_ = auVar26._8_4_;
      auVar31 = auVar31 & auVar28;
      auVar32._0_4_ = -(uint)(auVar31._0_4_ == 0);
      auVar32._4_4_ = -(uint)(auVar31._4_4_ == 0);
      auVar32._8_4_ = -(uint)(auVar31._8_4_ == 0);
      auVar32._12_4_ = -(uint)(auVar31._12_4_ == 0);
      auVar31 = auVar32 & auVar11 | ~auVar32 & auVar10;
      dVar23 = auVar31._0_8_;
      dVar25 = auVar31._8_8_;
      if ((bool)(~(auVar30._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar30._0_4_ ||
                  auVar24._4_4_ < auVar30._4_4_) & 1)) {
        dVar33 = dVar23 * 0.5;
        dVar27 = dVar33;
        if (uVar12 - 1 != uVar16) {
          dVar27 = dVar23;
        }
        if (uVar16 != 0) {
          dVar33 = dVar27;
        }
        local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar16] = dVar33;
      }
      if ((auVar30._12_4_ != auVar24._12_4_ || auVar30._8_4_ <= auVar24._8_4_) &&
          auVar30._12_4_ <= auVar24._12_4_) {
        dVar23 = dVar25 * 0.5;
        if ((ulong)(uVar12 - 1) - 1 != uVar16) {
          dVar23 = dVar25;
        }
        local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar16 + 1] = dVar23;
      }
      uVar16 = uVar16 + 2;
      lVar13 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + 2;
      auVar26._8_8_ = lVar13 + 2;
    } while ((uVar12 + 1 & 0xfffffffe) != uVar16);
  }
  this_00 = (local_148->super_TreeCompute).source_tree_;
  if (this_00->num_nodes_ != 0) {
    local_164 = uVar7 * uVar7;
    local_178 = (ulong)uVar7;
    local_c8 = sVar22 * 8;
    node_idx = 0;
    local_108 = local_150;
    local_110 = local_158;
    local_118 = local_160;
    local_100 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    pdVar14 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_140 = pdVar21;
    local_138 = sVar22;
    do {
      local_130 = node_idx;
      aVar34 = Tree::node_particle_idxs(this_00,node_idx);
      local_170 = aVar34._M_elems[1];
      local_180 = aVar34._M_elems[0];
      __n = local_170 - local_180;
      std::vector<int,_std::allocator<int>_>::vector(&local_f8,__n,(allocator_type *)local_78);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_78,__n,(allocator_type *)local_90);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_90,__n,(allocator_type *)local_48);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_48,__n,&local_181);
      if (local_170 != local_180) {
        sVar17 = 0;
        do {
          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar17] = -1;
          *(undefined4 *)((long)local_78[0] + sVar17 * 4) = 0xffffffff;
          *(undefined4 *)((long)local_90[0] + sVar17 * 4) = 0xffffffff;
          sVar17 = sVar17 + 1;
        } while (__n != sVar17);
        if (local_170 != local_180) {
          sVar17 = 0;
          do {
            if ((int)sVar22 < 1) {
              dVar23 = 0.0;
              dVar25 = 0.0;
              dVar33 = 0.0;
            }
            else {
              lVar13 = local_180 + sVar17;
              dVar27 = local_128[lVar13];
              dVar1 = pdVar21[lVar13];
              dVar2 = local_120[lVar13];
              dVar23 = 0.0;
              dVar25 = 0.0;
              dVar33 = 0.0;
              uVar16 = 0;
              do {
                dVar3 = local_108[uVar16];
                dVar4 = pdVar14[uVar16];
                dVar5 = local_118[uVar16];
                dVar6 = local_110[uVar16];
                iVar19 = (int)uVar16;
                if (ABS(dVar2 - dVar3) < 2.2250738585072014e-308) {
                  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar17] = iVar19;
                }
                auVar29._0_8_ = dVar27 - dVar5;
                auVar29._8_8_ = dVar1 - dVar6;
                if (ABS(auVar29._8_8_) < 2.2250738585072014e-308) {
                  *(int *)((long)local_78[0] + sVar17 * 4) = iVar19;
                }
                if (ABS(auVar29._0_8_) < 2.2250738585072014e-308) {
                  *(int *)((long)local_90[0] + sVar17 * 4) = iVar19;
                }
                dVar33 = dVar33 + dVar4 / (dVar2 - dVar3);
                auVar28._8_8_ = dVar4;
                auVar28._0_8_ = dVar4;
                auVar29 = divpd(auVar28,auVar29);
                dVar23 = dVar23 + auVar29._0_8_;
                dVar25 = dVar25 + auVar29._8_8_;
                uVar16 = uVar16 + 1;
              } while (local_178 != uVar16);
            }
            *(undefined8 *)((long)local_48[0] + sVar17 * 8) = 0x3ff0000000000000;
            dVar27 = 1.0;
            if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[sVar17] == -1) {
              dVar27 = 1.0 / dVar33;
              *(double *)((long)local_48[0] + sVar17 * 8) = dVar27;
            }
            if (*(int *)((long)local_78[0] + sVar17 * 4) == -1) {
              dVar27 = dVar27 / dVar25;
              *(double *)((long)local_48[0] + sVar17 * 8) = dVar27;
            }
            if (*(int *)((long)local_90[0] + sVar17 * 4) == -1) {
              *(double *)((long)local_48[0] + sVar17 * 8) = dVar27 / dVar23;
            }
            sVar17 = sVar17 + 1;
          } while (sVar17 != __n);
        }
      }
      if (0 < (int)sVar22) {
        lVar13 = local_130 * local_138;
        local_a0 = local_150 + lVar13;
        local_a8 = local_158 + lVar13;
        local_b0 = local_160 + lVar13;
        local_c0 = local_e0 + local_130 * local_d0;
        uVar16 = 0;
        do {
          local_b8 = local_c0 + local_164 * (int)uVar16;
          uVar15 = 0;
          do {
            local_98 = local_b8 + uVar15 * local_178;
            uVar20 = 0;
            do {
              dVar23 = 0.0;
              if (local_170 != local_180) {
                sVar22 = 0;
                do {
                  if ((ulong)(uint)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[sVar22] == 0xffffffff) {
                    dVar25 = local_100[uVar16] / (local_120[local_180 + sVar22] - local_a0[uVar16]);
                  }
                  else {
                    dVar25 = 1.0;
                    if (uVar16 != (uint)local_f8.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start[sVar22]) {
                      dVar25 = 0.0;
                    }
                  }
                  uVar18 = (ulong)*(uint *)((long)local_78[0] + sVar22 * 4);
                  if (uVar18 == 0xffffffff) {
                    dVar25 = dVar25 * (local_100[uVar15] /
                                      (local_140[local_180 + sVar22] - local_a8[uVar15]));
                  }
                  else if (uVar15 != uVar18) {
                    dVar25 = dVar25 * 0.0;
                  }
                  uVar18 = (ulong)*(uint *)((long)local_90[0] + sVar22 * 4);
                  if (uVar18 == 0xffffffff) {
                    dVar25 = dVar25 * (local_100[uVar20] /
                                      (local_128[local_180 + sVar22] - local_b0[uVar20]));
                  }
                  else if (uVar20 != uVar18) {
                    dVar25 = dVar25 * 0.0;
                  }
                  dVar23 = dVar23 + dVar25 * local_d8[local_180 + sVar22] *
                                    *(double *)((long)local_48[0] + sVar22 * 8);
                  sVar22 = sVar22 + 1;
                } while (__n != sVar22);
              }
              local_98[uVar20] = dVar23 + local_98[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar20 != local_178);
            uVar15 = uVar15 + 1;
          } while (uVar15 != local_178);
          uVar16 = uVar16 + 1;
        } while (uVar16 != local_178);
      }
      if (local_48[0] != (void *)0x0) {
        operator_delete(local_48[0],local_38 - (long)local_48[0]);
      }
      sVar22 = local_138;
      pdVar21 = local_140;
      if (local_90[0] != (void *)0x0) {
        operator_delete(local_90[0],local_80 - (long)local_90[0]);
      }
      pdVar14 = local_100;
      if (local_78[0] != (void *)0x0) {
        operator_delete(local_78[0],local_68 - (long)local_78[0]);
      }
      if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      node_idx = local_130 + 1;
      this_00 = (local_148->super_TreeCompute).source_tree_;
      local_118 = (pointer)((long)local_118 + local_c8);
      local_110 = (pointer)((long)local_110 + local_c8);
      local_108 = (pointer)((long)local_108 + local_c8);
    } while (node_idx < this_00->num_nodes_);
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SourceTermCompute::upward_pass()
{
//    timers_.upward_pass.start();

    int num_mol_interp_pts_per_node     = num_mol_interp_pts_per_node_;
    int num_mol_interp_charges_per_node = num_mol_interp_charges_per_node_;
    
    const double* __restrict mol_x_ptr = molecule_.x_ptr();
    const double* __restrict mol_y_ptr = molecule_.y_ptr();
    const double* __restrict mol_z_ptr = molecule_.z_ptr();
    
    const double* __restrict mol_q_ptr = molecule_.charge_ptr();
    
    const double* __restrict mol_clusters_x_ptr = mol_interp_pts_.interp_x_ptr();
    const double* __restrict mol_clusters_y_ptr = mol_interp_pts_.interp_y_ptr();
    const double* __restrict mol_clusters_z_ptr = mol_interp_pts_.interp_z_ptr();
    
    double*       __restrict mol_clusters_q_ptr = mol_interp_charge_.data();
    
        
    std::vector<double> weights (num_mol_interp_pts_per_node);
    double* weights_ptr = weights.data();
    int weights_num = weights.size();
    
    for (int i = 0; i < weights_num; ++i) {
        weights[i] = ((i % 2 == 0)? 1 : -1);
        if (i == 0 || i == weights_num-1) weights[i] = ((i % 2 == 0)? 1 : -1) * 0.5;
    }

    
#ifdef OPENACC_ENABLED
    #pragma acc enter data copyin(weights_ptr[0:weights_num])
#endif
    
    for (std::size_t node_idx = 0; node_idx < source_tree_.num_nodes(); ++node_idx) {
        
        auto particle_idxs = source_tree_.node_particle_idxs(node_idx);
        
        std::size_t node_interp_pts_start = node_idx * num_mol_interp_pts_per_node;
        std::size_t node_charges_start    = node_idx * num_mol_interp_charges_per_node;
        
        std::size_t particle_start = particle_idxs[0];
        std::size_t num_particles  = particle_idxs[1] - particle_idxs[0];
        
        std::vector<int> exact_idx_x(num_particles);
        std::vector<int> exact_idx_y(num_particles);
        std::vector<int> exact_idx_z(num_particles);
        std::vector<double> denominator(num_particles);
        
        int* exact_idx_x_ptr = exact_idx_x.data();
        int* exact_idx_y_ptr = exact_idx_y.data();
        int* exact_idx_z_ptr = exact_idx_z.data();
        double* denominator_ptr = denominator.data();
        
#ifdef OPENACC_ENABLED
#pragma acc kernels present(mol_x_ptr, mol_y_ptr, mol_z_ptr, mol_q_ptr, \
                            mol_clusters_x_ptr, mol_clusters_y_ptr, mol_clusters_z_ptr, \
                            mol_clusters_q_ptr, weights_ptr) \
                  create(exact_idx_x_ptr[0:num_particles], exact_idx_y_ptr[0:num_particles], \
                         exact_idx_z_ptr[0:num_particles], denominator_ptr[0:num_particles])
#endif
        {

#ifdef OPENACC_ENABLED
        #pragma acc loop vector(32) independent
#endif
        for (std::size_t i = 0; i < num_particles; ++i) {
            exact_idx_x_ptr[i] = -1;
            exact_idx_y_ptr[i] = -1;
            exact_idx_z_ptr[i] = -1;
        }

#ifdef OPENACC_ENABLED
        #pragma acc loop independent
#endif
        for (std::size_t i = 0; i < num_particles; ++i) {
        
            double denominator_x = 0.;
            double denominator_y = 0.;
            double denominator_z = 0.;
            
            double xx = mol_x_ptr[particle_start + i];
            double yy = mol_y_ptr[particle_start + i];
            double zz = mol_z_ptr[particle_start + i];

            // because there's a reduction over exact_idx[i], this loop carries a
            // backward dependence and won't actually parallelize
#ifdef OPENACC_ENABLED
            #pragma acc loop reduction(+:denominator_x,denominator_y,denominator_z)
#endif
            for (int j = 0; j < num_mol_interp_pts_per_node; ++j) {
            
                double dist_x = xx - mol_clusters_x_ptr[node_interp_pts_start + j];
                double dist_y = yy - mol_clusters_y_ptr[node_interp_pts_start + j];
                double dist_z = zz - mol_clusters_z_ptr[node_interp_pts_start + j];
                
                denominator_x += weights_ptr[j] / dist_x;
                denominator_y += weights_ptr[j] / dist_y;
                denominator_z += weights_ptr[j] / dist_z;
                
                if (std::abs(dist_x) < std::numeric_limits<double>::min()) exact_idx_x_ptr[i] = j;
                if (std::abs(dist_y) < std::numeric_limits<double>::min()) exact_idx_y_ptr[i] = j;
                if (std::abs(dist_z) < std::numeric_limits<double>::min()) exact_idx_z_ptr[i] = j;
            }
            
            denominator_ptr[i] = 1.0;
            if (exact_idx_x_ptr[i] == -1) denominator_ptr[i] /= denominator_x;
            if (exact_idx_y_ptr[i] == -1) denominator_ptr[i] /= denominator_y;
            if (exact_idx_z_ptr[i] == -1) denominator_ptr[i] /= denominator_z;
        }

#ifdef OPENACC_ENABLED
        #pragma acc loop collapse(3) independent
#endif
        for (int k1 = 0; k1 < num_mol_interp_pts_per_node; ++k1) {
        for (int k2 = 0; k2 < num_mol_interp_pts_per_node; ++k2) {
        for (int k3 = 0; k3 < num_mol_interp_pts_per_node; ++k3) {
        
            std::size_t kk = node_charges_start
                   + k1 * num_mol_interp_pts_per_node * num_mol_interp_pts_per_node
                   + k2 * num_mol_interp_pts_per_node + k3;
                   
            double cx = mol_clusters_x_ptr[node_interp_pts_start + k1];
            double w1 = weights_ptr[k1];

            double cy = mol_clusters_y_ptr[node_interp_pts_start + k2];
            double w2 = weights_ptr[k2];
            
            double cz = mol_clusters_z_ptr[node_interp_pts_start + k3];
            double w3 = weights_ptr[k3];
            
            double q_temp = 0.;
            
#ifdef OPENACC_ENABLED
            #pragma acc loop reduction(+:q_temp)
#endif
            for (std::size_t i = 0; i < num_particles; i++) {  // loop over source points
            
                double dist_x = mol_x_ptr[particle_start + i] - cx;
                double dist_y = mol_y_ptr[particle_start + i] - cy;
                double dist_z = mol_z_ptr[particle_start + i] - cz;
                
                double numerator = 1.;

                // If exact_idx[i] == -1, then no issues.
                // If exact_idx[i] != -1, then we want to zero out terms EXCEPT when exactInd=k1.
                if (exact_idx_x_ptr[i] == -1) {
                    numerator *= w1 / dist_x;
                } else {
                    if (exact_idx_x_ptr[i] != k1) numerator *= 0.;
                }

                if (exact_idx_y_ptr[i] == -1) {
                    numerator *= w2 / dist_y;
                } else {
                    if (exact_idx_y_ptr[i] != k2) numerator *= 0.;
                }

                if (exact_idx_z_ptr[i] == -1) {
                    numerator *= w3 / dist_z;
                } else {
                    if (exact_idx_z_ptr[i] != k3) numerator *= 0.;
                }

                q_temp += mol_q_ptr[particle_start + i] * numerator * denominator_ptr[i];
            }
            
            mol_clusters_q_ptr[kk] += q_temp;
        }
        }
        }
        
        } // end parallel region
    } // end loop over nodes
#ifdef OPENACC_ENABLED
    #pragma acc exit data delete(weights_ptr[0:weights_num])
#endif

//    timers_.upward_pass.stop();
}